

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkExtractCisForThisRead(Vec_Int_t *vReachReadCi,int iRead)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vRes;
  int k;
  int iRead_local;
  Vec_Int_t *vReachReadCi_local;
  
  p = Vec_IntAlloc(100);
  for (vRes._0_4_ = 0; iVar1 = Vec_IntSize(vReachReadCi), (int)vRes < iVar1 / 3;
      vRes._0_4_ = (int)vRes + 1) {
    iVar1 = Vec_IntEntry(vReachReadCi,(int)vRes * 3);
    if (iRead == iVar1) {
      iVar1 = Vec_IntEntry(vReachReadCi,(int)vRes * 3 + 1);
      Vec_IntPush(p,iVar1);
      iVar1 = Vec_IntEntry(vReachReadCi,(int)vRes * 3 + 2);
      Vec_IntPush(p,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Wlc_NtkExtractCisForThisRead( Vec_Int_t * vReachReadCi, int iRead )
{
    int k;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    for ( k = 0; k < Vec_IntSize(vReachReadCi)/3; k++ )
    {
        if ( iRead != Vec_IntEntry( vReachReadCi, 3*k ) )
            continue;
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+1 ) );
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+2 ) );
    }
    return vRes;
}